

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O2

size_t FStringTable::ProcessEscapes(char *iptr)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *optr;
  
  pcVar2 = iptr;
  pcVar3 = iptr;
  do {
    pcVar1 = pcVar3 + 1;
    do {
      pcVar3 = pcVar1;
      cVar4 = pcVar3[-1];
      if (cVar4 != '\\') {
        if (cVar4 == '\0') {
          *pcVar2 = '\0';
          return (long)pcVar2 - (long)iptr;
        }
        goto LAB_00508a9b;
      }
      cVar4 = *pcVar3;
      pcVar1 = pcVar3 + 2;
    } while (cVar4 == '\n');
    pcVar3 = pcVar3 + 1;
    if (cVar4 == 't') {
      cVar4 = '\t';
    }
    else if (cVar4 == 'n') {
      cVar4 = '\n';
    }
    else if (cVar4 == 'r') {
      cVar4 = '\r';
    }
    else if (cVar4 == 'c') {
      cVar4 = '\x1c';
    }
LAB_00508a9b:
    *pcVar2 = cVar4;
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

size_t FStringTable::ProcessEscapes (char *iptr)
{
	char *sptr = iptr, *optr = iptr, c;

	while ((c = *iptr++) != '\0')
	{
		if (c == '\\')
		{
			c = *iptr++;
			if (c == 'n')
				c = '\n';
			else if (c == 'c')
				c = TEXTCOLOR_ESCAPE;
			else if (c == 'r')
				c = '\r';
			else if (c == 't')
				c = '\t';
			else if (c == '\n')
				continue;
		}
		*optr++ = c;
	}
	*optr = '\0';
	return optr - sptr;
}